

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O0

void __thiscall
myvk::ImGuiRenderer::create_pipeline
          (ImGuiRenderer *this,Ptr<RenderPass> *render_pass,uint32_t subpass)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPushConstantRange> __l_00;
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  uint in_EDX;
  VkGraphicsPipelineCreateInfo pipeline_info;
  VkPipelineColorBlendStateCreateInfo color_blending;
  VkPipelineColorBlendAttachmentState color_blend_attachment;
  VkPipelineMultisampleStateCreateInfo multisampling;
  VkPipelineRasterizationStateCreateInfo rasterizer;
  VkPipelineViewportStateCreateInfo viewport_state;
  VkPipelineDynamicStateCreateInfo dynamic_state;
  VkDynamicState dynamic_states [2];
  VkPipelineInputAssemblyStateCreateInfo input_assembly;
  VkPipelineVertexInputStateCreateInfo vertex_input_info;
  VkVertexInputAttributeDescription attribute_desc [3];
  VkVertexInputBindingDescription binding_desc [1];
  VkPipelineShaderStageCreateInfo shader_stages [2];
  Ptr<ShaderModule> frag_shader_module;
  Ptr<ShaderModule> vert_shader_module;
  VkPushConstantRange push_constant;
  Ptr<Device> *device;
  shared_ptr<myvk::DescriptorSetLayout> *in_stack_fffffffffffffb98;
  shared_ptr<myvk::DescriptorSetLayout> *in_stack_fffffffffffffba0;
  VkSpecializationInfo *in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  VkShaderStageFlagBits stage;
  ShaderModule *in_stack_fffffffffffffbc0;
  allocator_type *in_stack_fffffffffffffbc8;
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_fffffffffffffbd0;
  iterator in_stack_fffffffffffffbd8;
  size_type in_stack_fffffffffffffbe0;
  undefined8 ***local_408;
  undefined8 ***pppuVar3;
  uint32_t code_size;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *code;
  Ptr<Device> *in_stack_fffffffffffffc28;
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_fffffffffffffc78;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_fffffffffffffc80;
  Ptr<Device> *in_stack_fffffffffffffc88;
  allocator<VkPushConstantRange> local_c9;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> local_79;
  undefined8 **local_78 [2];
  undefined1 ***local_68;
  undefined8 local_60;
  undefined8 local_30;
  undefined4 local_28;
  undefined8 local_20;
  uint local_14;
  
  local_14 = in_EDX;
  peVar2 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2952b8);
  iVar1 = (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_20 = CONCAT44(extraout_var,iVar1);
  local_30 = 1;
  local_28 = 0x10;
  pppuVar3 = local_78;
  std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_60 = 1;
  code = &local_79;
  local_68 = (undefined1 ***)pppuVar3;
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *)0x295360);
  __l._M_len = in_stack_fffffffffffffbe0;
  __l._M_array = (iterator)in_stack_fffffffffffffbd8;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)in_stack_fffffffffffffbd0,__l,(allocator_type *)in_stack_fffffffffffffbc8);
  local_c0 = local_28;
  local_c8 = local_30;
  local_b8 = &local_c8;
  local_b0 = 1;
  std::allocator<VkPushConstantRange>::allocator((allocator<VkPushConstantRange> *)0x2953d3);
  __l_00._M_len = in_stack_fffffffffffffbe0;
  __l_00._M_array = in_stack_fffffffffffffbd8;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            (in_stack_fffffffffffffbd0,__l_00,in_stack_fffffffffffffbc8);
  PipelineLayout::Create
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            ((shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffffba0,
             (shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffffb98);
  std::shared_ptr<myvk::PipelineLayout>::~shared_ptr((shared_ptr<myvk::PipelineLayout> *)0x29543e);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)
             in_stack_fffffffffffffbb0);
  std::allocator<VkPushConstantRange>::~allocator(&local_c9);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)in_stack_fffffffffffffbb0);
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::~allocator(&local_79);
  local_408 = &local_68;
  do {
    local_408 = local_408 + -2;
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x29549b);
    code_size = (uint32_t)((ulong)pppuVar3 >> 0x20);
    stage = (VkShaderStageFlagBits)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  } while (local_408 != local_78);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x2954bc);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x2954c9);
  ShaderModule::Create(in_stack_fffffffffffffc28,(uint32_t *)code,code_size);
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffffba0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffffb98);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x295510);
  ShaderModule::Create(in_stack_fffffffffffffc28,(uint32_t *)code,code_size);
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffffba0,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffffb98);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x295557);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x295564);
  ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffffbc0,stage,in_stack_fffffffffffffbb0);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x295599);
  ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffffbc0,stage,in_stack_fffffffffffffbb0);
  GraphicsPipeline::Create
            ((Ptr<PipelineLayout> *)0x0,(Ptr<RenderPass> *)(ulong)local_14,
             (VkGraphicsPipelineCreateInfo *)0x0);
  std::shared_ptr<myvk::GraphicsPipeline>::operator=
            ((shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffba0,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffffb98);
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x295a69);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x295a76);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x295a83);
  return;
}

Assistant:

void ImGuiRenderer::create_pipeline(const Ptr<RenderPass> &render_pass, uint32_t subpass) {
	const Ptr<Device> &device = render_pass->GetDevicePtr();
	{
		VkPushConstantRange push_constant = {};
		push_constant.stageFlags = VK_SHADER_STAGE_VERTEX_BIT;
		push_constant.offset = sizeof(float) * 0;
		push_constant.size = sizeof(float) * 4;

		m_pipeline_layout = PipelineLayout::Create(device, {m_descriptor_set_layout}, {push_constant});
	}
	{
		Ptr<ShaderModule> vert_shader_module, frag_shader_module;
		vert_shader_module = ShaderModule::Create(device, kShaderVertSpv, sizeof(kShaderVertSpv));
		frag_shader_module = ShaderModule::Create(device, kShaderFragSpv, sizeof(kShaderFragSpv));

		VkPipelineShaderStageCreateInfo shader_stages[] = {
		    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
		    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

		VkVertexInputBindingDescription binding_desc[1] = {};
		binding_desc[0].stride = sizeof(ImDrawVert);
		binding_desc[0].inputRate = VK_VERTEX_INPUT_RATE_VERTEX;

		VkVertexInputAttributeDescription attribute_desc[3] = {};
		attribute_desc[0].location = 0;
		attribute_desc[0].binding = binding_desc[0].binding;
		attribute_desc[0].format = VK_FORMAT_R32G32_SFLOAT;
		attribute_desc[0].offset = IM_OFFSETOF(ImDrawVert, pos);
		attribute_desc[1].location = 1;
		attribute_desc[1].binding = binding_desc[0].binding;
		attribute_desc[1].format = VK_FORMAT_R32G32_SFLOAT;
		attribute_desc[1].offset = IM_OFFSETOF(ImDrawVert, uv);
		attribute_desc[2].location = 2;
		attribute_desc[2].binding = binding_desc[0].binding;
		attribute_desc[2].format = VK_FORMAT_R8G8B8A8_UNORM;
		attribute_desc[2].offset = IM_OFFSETOF(ImDrawVert, col);

		VkPipelineVertexInputStateCreateInfo vertex_input_info = {};
		vertex_input_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
		vertex_input_info.vertexBindingDescriptionCount = 1;
		vertex_input_info.pVertexBindingDescriptions = binding_desc;
		vertex_input_info.vertexAttributeDescriptionCount = 3;
		vertex_input_info.pVertexAttributeDescriptions = attribute_desc;

		VkPipelineInputAssemblyStateCreateInfo input_assembly = {};
		input_assembly.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
		input_assembly.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		input_assembly.primitiveRestartEnable = VK_FALSE;

		VkDynamicState dynamic_states[2] = {VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR};
		VkPipelineDynamicStateCreateInfo dynamic_state = {};
		dynamic_state.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
		dynamic_state.dynamicStateCount = (uint32_t)IM_ARRAYSIZE(dynamic_states);
		dynamic_state.pDynamicStates = dynamic_states;

		VkPipelineViewportStateCreateInfo viewport_state = {};
		viewport_state.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
		viewport_state.viewportCount = 1;
		viewport_state.scissorCount = 1;

		VkPipelineRasterizationStateCreateInfo rasterizer = {};
		rasterizer.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
		rasterizer.depthClampEnable = VK_FALSE;
		rasterizer.rasterizerDiscardEnable = VK_FALSE;
		rasterizer.polygonMode = VK_POLYGON_MODE_FILL;
		rasterizer.lineWidth = 1.0f;
		rasterizer.cullMode = VK_CULL_MODE_NONE;
		rasterizer.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
		rasterizer.depthBiasEnable = VK_FALSE;

		VkPipelineMultisampleStateCreateInfo multisampling = {};
		multisampling.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
		multisampling.sampleShadingEnable = VK_FALSE;
		multisampling.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
		multisampling.minSampleShading = 1.0f;
		multisampling.pSampleMask = nullptr;
		multisampling.alphaToCoverageEnable = VK_FALSE;
		multisampling.alphaToOneEnable = VK_FALSE;

		VkPipelineColorBlendAttachmentState color_blend_attachment = {};
		color_blend_attachment.blendEnable = VK_TRUE;
		color_blend_attachment.srcColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
		color_blend_attachment.dstColorBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
		color_blend_attachment.colorBlendOp = VK_BLEND_OP_ADD;
		color_blend_attachment.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
		color_blend_attachment.dstAlphaBlendFactor = VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA;
		color_blend_attachment.alphaBlendOp = VK_BLEND_OP_ADD;
		color_blend_attachment.colorWriteMask =
		    VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;

		VkPipelineColorBlendStateCreateInfo color_blending = {};
		color_blending.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
		color_blending.attachmentCount = 1;
		color_blending.pAttachments = &color_blend_attachment;

		VkGraphicsPipelineCreateInfo pipeline_info = {};
		pipeline_info.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
		pipeline_info.stageCount = 2;
		pipeline_info.pStages = shader_stages;
		pipeline_info.pVertexInputState = &vertex_input_info;
		pipeline_info.pInputAssemblyState = &input_assembly;
		pipeline_info.pViewportState = &viewport_state;
		pipeline_info.pRasterizationState = &rasterizer;
		pipeline_info.pMultisampleState = &multisampling;
		pipeline_info.pDepthStencilState = nullptr;
		pipeline_info.pColorBlendState = &color_blending;
		pipeline_info.pDynamicState = &dynamic_state;
		pipeline_info.subpass = subpass;

		m_pipeline = GraphicsPipeline::Create(m_pipeline_layout, render_pass, pipeline_info);
	}
}